

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void kj::anon_unknown_6::registerSignalHandler(int signum)

{
  int iVar1;
  Fault f;
  sigset_t mask;
  
  (anonymous_namespace)::tooLateToSetReserved = 1;
  do {
    iVar1 = sigemptyset((sigset_t *)&mask);
    if (-1 < iVar1) goto LAB_0049e4bb;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x56,iVar1,"sigemptyset(&mask)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_0049e4bb:
  do {
    iVar1 = sigaddset((sigset_t *)&mask,signum);
    if (-1 < iVar1) goto LAB_0049e4db;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x57,iVar1,"sigaddset(&mask, signum)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_0049e4db:
  do {
    iVar1 = sigprocmask(0,(sigset_t *)&mask,(sigset_t *)0x0);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x58,iVar1,"sigprocmask(SIG_BLOCK, &mask, nullptr)","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void registerSignalHandler(int signum) {
  tooLateToSetReserved = true;

  sigset_t mask;
  KJ_SYSCALL(sigemptyset(&mask));
  KJ_SYSCALL(sigaddset(&mask, signum));
  KJ_SYSCALL(sigprocmask(SIG_BLOCK, &mask, nullptr));

#if !KJ_USE_EPOLL  // on Linux we'll use signalfd
  struct sigaction action;
  memset(&action, 0, sizeof(action));
  action.sa_sigaction = &signalHandler;
  KJ_SYSCALL(sigfillset(&action.sa_mask));
  action.sa_flags = SA_SIGINFO;
  KJ_SYSCALL(sigaction(signum, &action, nullptr));
#endif
}